

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

_Bool script_is_op_n(uchar op,_Bool allow_zero,size_t *n)

{
  ulong uVar1;
  undefined3 in_register_00000039;
  
  if (CONCAT31(in_register_00000039,op) == 0 && allow_zero) {
    if (n == (size_t *)0x0) {
      return true;
    }
    uVar1 = 0;
  }
  else {
    if (0xf < (byte)(op + 0xaf)) {
      return false;
    }
    if (n == (size_t *)0x0) {
      return true;
    }
    uVar1 = (ulong)(CONCAT31(in_register_00000039,op) - 0x50);
  }
  *n = uVar1;
  return true;
}

Assistant:

bool script_is_op_n(unsigned char op, bool allow_zero, size_t *n) {
    if (allow_zero && op == OP_0) {
        if (n)
            *n = 0;
        return true;
    }
    if (op >= OP_1 && op <= OP_16) {
        if (n)
            *n = op - OP_1 + 1;
        return true;
    }
    return false;
}